

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

void benchmark::AppendHumanReadable(int n,string *str)

{
  ostream *poVar1;
  int precision;
  string local_1f0 [32];
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  string *local_18;
  string *str_local;
  int n_local;
  
  local_18 = str;
  str_local._4_4_ = n;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"/");
  ToBinaryStringFullySpecified_abi_cxx11_
            (&local_1d0,(benchmark *)0x0,(double)str_local._4_4_,1.0,precision);
  std::operator<<(poVar1,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=((string *)local_18,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void AppendHumanReadable(int n, std::string* str) {
  std::stringstream ss;
  // Round down to the nearest SI prefix.
  ss << "/" << ToBinaryStringFullySpecified(n, 1.0, 0);
  *str += ss.str();
}